

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void yoshi(dw_rom *rom)

{
  dw_rom *rom_local;
  
  vpatch(rom,0x14f5,0xf,3,0xa9,0,0xaa,0,0xab,0,0xac,3,0xad,0,0xae,0,0xaf,0);
  vpatch(rom,0x15f5,0xf,0,0xb5,0,0xb2,0,0xb3,0,0xb4,0,0xb5,0,0xb6,0,0xb7,0);
  vpatch(rom,0x16f5,0xf,0,0xb9,3,0xba,0,0xbb,0,0xbc,0,0xbd,3,0xbe,0,0xbf,0);
  vpatch(rom,0x1a8b,3,0x30,0x19,7);
  vpatch(rom,0x12200,0x20,0,0,1,9,9,9,1,0,3,7,7,7,7,7,7,3,0,0,0x80,0x90,0x90,0x90,0x80,0,0xc0,0xe0,
         0xe0,0xe0,0xe0,0xe0,0xe0,0xc0);
  vpatch(rom,0x12240,0x60,0,1,3,3,1,0,0,3,3,0xe,0x3d,0x35,6,3,1,3,0,0x80,0xc0,0xc0,0x80,0,0x60,0,
         0xd8,0x78,0xb0,0xa0,0x60,0xe0,0xe0,0,0,0,0,0,4,8,9,5,0,1,1,3,7,0xf,0xe,6,0,0x40,0xc0,0xc0,0
         ,0xc0,0xe0,0xe0,0xc0,0x80,0x5c,0x7e,0xfe,0x3e,0x1c,0,6,2);
  vpatch(rom,0x12300,0x80,0,0,0,0,4,8,9,5,0,1,1,3,7,0xf,0xe,6,0,0x40,0xc0,0xc0,0,0xc0,0xe0,0xe0,0xc0
         ,0x80,0x5c,0x7e,0xfe,0x3e,0x1c,0,6,2,0xe,0x4c,0x20,0x10,9,0xc,7,0x43,0x6d,0x33,0x1f,0xf,7,
         0xc,0xc0,0x20,0x20,0x20,0,0xc0,0x80,0,0x20,0xc0,0xc0,0xd8,0xf8,0,0x80,0,0,2);
  vpatch(rom,0x12400,0x180,0,0,1,9,9,9,1,0,3,7,7,7,7,7,7,3,0,0,0x80,0x98,0x98,0x98,0x88,8,0xc0,0xe0,
         0xe0,0xf0,0xf0,0xf0,0xe0,0xc0,0,1,3,3,1,0,0,3,3,0xe,0x3d,0x35,6,3,1,3,0,0x80,0xc0,0xc0,0x80
         ,0,0x60,0,0xd8,0x78,0xb0,0xa0,0x60,0xe0,0xe0,0,0,0);
  vpatch(rom,0x12600,0x10,0,0,1,9,9,9,1,0,3,7,7,7,7,7,7,3);
  vpatch(rom,0x12620,0x10,0x38,0x71,0x43,0x4b,0x79,0x38,0,3,0x3b,0x4e,0x7d,0x75,0x46,0x3b,1,3);
  vpatch(rom,0x12640,0x10,0,0,1,9,9,9,0x19,0x3c,3,7,7,7,7,7,0x1f,0x23);
  vpatch(rom,0x12660,0x10,0x24,0x21,0x33,0x1b,1,0,6,0,0x3b,0x3e,0x2d,0x1d,6,7,7,0);
  vpatch(rom,0x12710,0x10,0,0x40,0x60,0,0,0,0,0x1c,0x40,0xa0,0xc0,0xe0,0xf0,0xf0,0xe0,0xdc);
  vpatch(rom,0x12730,0x10,0xbe,0xf6,0xf6,0xfe,0x9c,0,0,0x60,0x62,0x2a,0x2a,0x22,0x7c,0xe0,0x60,0x60)
  ;
  vpatch(rom,0x12750,0x10,0,0x40,0x60,0,0,0,0x38,0x7c,0x40,0xa0,0xc0,0xe0,0xf0,0xf0,0xf8,0xc4);
  vpatch(rom,0x12770,0xf,0xec,0xec,0xfc,0xf8,0x80,0,0x60,0,0x54,0x54,0x44,0x38,0x60,0xe0,0x60);
  vpatch(rom,0x12800,0x10,0,0,1,9,9,9,1,0,3,7,7,7,7,7,7,3);
  vpatch(rom,0x12820,0x10,0x38,0x71,0x43,0x4b,0x79,0x38,0,3,0x3b,0x4e,0x7d,0x75,0x46,0x3b,1,3);
  vpatch(rom,0x12840,0x10,0,0,1,9,9,9,0x19,0x3c,3,7,7,7,7,7,0x1f,0x23);
  vpatch(rom,0x12860,0x10,0x24,0x21,0x33,0x1b,1,0,6,0,0x3b,0x3e,0x2d,0x1d,6,7,7,0);
  vpatch(rom,0x12910,0x10,0,0x40,0x60,0,0,0,0,0x1c,0x40,0xa0,0xc0,0xe0,0xf0,0xf0,0xe0,0xdc);
  vpatch(rom,0x12930,0x10,0xbe,0xf6,0xf6,0xfe,0x9c,0,0,0x60,0x62,0x2a,0x2a,0x22,0x7c,0xe0,0x60,0x60)
  ;
  vpatch(rom,0x12950,0x10,0,0x40,0x60,0,0,0,0x38,0x7c,0x40,0xa0,0xc0,0xe0,0xf0,0xf0,0xf8,0xc4);
  vpatch(rom,0x12970,0x90,0xec,0xec,0xfc,0xf8,0x80,0,0x60,0,0x54,0x54,0x44,0x38,0x60,0xe0,0x60,0,0,2
         ,3,3,0,3,7,0x1f,3,1,0x3a,0x7e,0x7f,0x7c,0x38,0x1c,0,0,0,0,0x20,0x10,0x90,0xa0,0,0x80,0x80,
         0xc0,0xe0,0xf0,0x70,0x60,0x3f,0x36,0x36,0x3e,0x1e,3,1,0,0x22,0x2b,0x2b,0x23,0x1d,0,1,0,0x60
         ,0x40);
  vpatch(rom,0x12a20,0xdf,0x1f,0x1f,0x1f,0x10,0,0,0,3,4,4,8,3,3,3,3,3,0xf0,0xf8,0xf8,0xfc,0x80,0,
         0x60,0,0x40,0x40,0x20,0x20,0x60,0xe0,0x60,0,7,0x1f,0x1f,0x1f,0x1f,0xf,0xf,7,3,0xf,0x1f,0x1f
         ,0x1f,0xf,0,7,0xe0,0xf8,0xf8,0xf8,0xf8,0xf0,0xf0,0xe0,0xc0,0xf0,0xf8,0xf8,0xf8,0xf0,0,0xe0,
         0xf,0x1f);
  vpatch(rom,0x12b20,0xe0,8,8,3,0x13,0x39,0x38,6,0,7,7,0xc,0xc,0xe,0x17,6,0,0x10,0x18,200,0xcc,0x9e,
         0x1e,6,0x60,0xe0,0xe0,0x30,0x38,0x68,0xe4,100,0x60,0x1f,0xf,0x1d,0x1a,0x1e,0x18,0x10,0,0xc,
         3,0xf,0x1d,0x1b,0x1f,0x1f,0xf,0xf8,0xf0,0xb8,0x58,0x78,0x18,8,0,0x30,0xc0,0xf0,0xb8,0xd8,
         0xf8,0xf8,0xf0,8,0x18);
  return;
}

Assistant:

static void yoshi(dw_rom *rom)
{
    vpatch(rom, 0x014f5,   15,  0x03,  0xa9,  0x00,  0xaa,  0x00,  0xab,  0x00,  0xac,  0x03,  0xad,  0x00,  0xae,  0x00,  0xaf,  0x00);
    vpatch(rom, 0x015f5,   15,  0x00,  0xb5,  0x00,  0xb2,  0x00,  0xb3,  0x00,  0xb4,  0x00,  0xb5,  0x00,  0xb6,  0x00,  0xb7,  0x00);
    vpatch(rom, 0x016f5,   15,  0x00,  0xb9,  0x03,  0xba,  0x00,  0xbb,  0x00,  0xbc,  0x00,  0xbd,  0x03,  0xbe,  0x00,  0xbf,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x30,  0x19,  0x07);
    vpatch(rom, 0x12200,   32,  0x00,  0x00,  0x01,  0x09,  0x09,  0x09,  0x01,  0x00,  0x03,  0x07,  0x07,  0x07,  0x07,  0x07,  0x07,  0x03,  0x00,  0x00,  0x80,  0x90,  0x90,  0x90,  0x80,  0x00,  0xc0,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xc0);
    vpatch(rom, 0x12240,   96,  0x00,  0x01,  0x03,  0x03,  0x01,  0x00,  0x00,  0x03,  0x03,  0x0e,  0x3d,  0x35,  0x06,  0x03,  0x01,  0x03,  0x00,  0x80,  0xc0,  0xc0,  0x80,  0x00,  0x60,  0x00,  0xd8,  0x78,  0xb0,  0xa0,  0x60,  0xe0,  0xe0,  0x00,  0x00,  0x00,  0x00,  0x00,  0x04,  0x08,  0x09,  0x05,  0x00,  0x01,  0x01,  0x03,  0x07,  0x0f,  0x0e,  0x06,  0x00,  0x40,  0xc0,  0xc0,  0x00,  0xc0,  0xe0,  0xe0,  0xc0,  0x80,  0x5c,  0x7e,  0xfe,  0x3e,  0x1c,  0x00,  0x06,  0x02,  0x0e,  0x4c,  0x20,  0x10,  0x0c,  0x01,  0x07,  0x43,  0x6d,  0x33,  0x1f,  0x0f,  0x0f,  0x01,  0xc0,  0x20,  0x20,  0x00,  0x60,  0xc0,  0x00,  0x80,  0x20,  0xc0,  0xd8,  0xf8,  0x80,  0x00,  0x80,  0x80);
    vpatch(rom, 0x12300,  128,  0x00,  0x00,  0x00,  0x00,  0x04,  0x08,  0x09,  0x05,  0x00,  0x01,  0x01,  0x03,  0x07,  0x0f,  0x0e,  0x06,  0x00,  0x40,  0xc0,  0xc0,  0x00,  0xc0,  0xe0,  0xe0,  0xc0,  0x80,  0x5c,  0x7e,  0xfe,  0x3e,  0x1c,  0x00,  0x06,  0x02,  0x0e,  0x4c,  0x20,  0x10,  0x09,  0x0c,  0x07,  0x43,  0x6d,  0x33,  0x1f,  0x0f,  0x07,  0x0c,  0xc0,  0x20,  0x20,  0x20,  0x00,  0xc0,  0x80,  0x00,  0x20,  0xc0,  0xc0,  0xd8,  0xf8,  0x00,  0x80,  0x00,  0x00,  0x02,  0x06,  0x00,  0x00,  0x00,  0x00,  0x00,  0x02,  0x05,  0x03,  0x07,  0x0f,  0x0f,  0x07,  0x03,  0x00,  0x40,  0x60,  0x00,  0x00,  0x00,  0x00,  0x00,  0x40,  0xa0,  0xc0,  0xe0,  0xf0,  0xf0,  0xe0,  0xc0,  0x01,  0x03,  0x03,  0x03,  0x01,  0x00,  0x06,  0x00,  0x1a,  0x1c,  0x0c,  0x04,  0x06,  0x07,  0x06,  0x00,  0x80,  0xc0,  0xc0,  0xc0,  0x80,  0x00,  0x00,  0x60,  0x40,  0x20,  0x38,  0x38,  0x60,  0xe0,  0x60,  0x60);
    vpatch(rom, 0x12400,  384,  0x00,  0x00,  0x01,  0x09,  0x09,  0x09,  0x01,  0x00,  0x03,  0x07,  0x07,  0x07,  0x07,  0x07,  0x07,  0x03,  0x00,  0x00,  0x80,  0x98,  0x98,  0x98,  0x88,  0x08,  0xc0,  0xe0,  0xe0,  0xf0,  0xf0,  0xf0,  0xe0,  0xc0,  0x00,  0x01,  0x03,  0x03,  0x01,  0x00,  0x00,  0x03,  0x03,  0x0e,  0x3d,  0x35,  0x06,  0x03,  0x01,  0x03,  0x00,  0x80,  0xc0,  0xc0,  0x80,  0x00,  0x60,  0x00,  0xd8,  0x78,  0xb0,  0xa0,  0x60,  0xe0,  0xe0,  0x00,  0x00,  0x00,  0x01,  0x09,  0x09,  0x09,  0x01,  0x00,  0x03,  0x07,  0x07,  0x07,  0x07,  0x07,  0x07,  0x03,  0x00,  0x00,  0x80,  0x90,  0x90,  0x94,  0x84,  0x04,  0xc0,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xe0,  0xc0,  0x00,  0x01,  0x03,  0x03,  0x01,  0x00,  0x06,  0x00,  0x1b,  0x1e,  0x0d,  0x05,  0x06,  0x07,  0x07,  0x00,  0x04,  0x84,  0xc0,  0xc0,  0x80,  0x00,  0x00,  0xc0,  0xc0,  0x70,  0xbc,  0xac,  0x60,  0xc0,  0x80,  0xc0,  0x00,  0x00,  0x00,  0x00,  0x04,  0x08,  0x09,  0x05,  0x00,  0x01,  0x01,  0x03,  0x07,  0x0f,  0x0e,  0x06,  0x00,  0x40,  0xc0,  0xc0,  0x00,  0xc8,  0xe8,  0xe8,  0xc0,  0x80,  0x5c,  0x7e,  0xfe,  0x36,  0x14,  0x00,  0x06,  0x02,  0x0e,  0x4c,  0x20,  0x10,  0x09,  0x0c,  0x07,  0x43,  0x6d,  0x33,  0x1f,  0x0f,  0x07,  0x0c,  0xc8,  0x28,  0x20,  0x00,  0x60,  0xc0,  0x80,  0x00,  0x20,  0xc0,  0xd8,  0xf8,  0x80,  0x00,  0x80,  0x00,  0x00,  0x00,  0x00,  0x00,  0x04,  0x08,  0x09,  0x05,  0x00,  0x01,  0x01,  0x03,  0x07,  0x0f,  0x0e,  0x06,  0x00,  0x40,  0xc0,  0xc0,  0x08,  0xc8,  0xe8,  0xe8,  0xc0,  0x80,  0x5c,  0x7e,  0xf6,  0x36,  0x14,  0x00,  0x06,  0x02,  0x0e,  0x4c,  0x20,  0x10,  0x0c,  0x01,  0x07,  0x43,  0x6d,  0x33,  0x1f,  0x0f,  0x0f,  0x01,  0xc8,  0x20,  0x00,  0x20,  0x60,  0xc0,  0x80,  0x80,  0x20,  0xd8,  0xf8,  0xc0,  0x80,  0x00,  0x00,  0x80,  0x00,  0x02,  0x06,  0x10,  0x10,  0x10,  0x10,  0x10,  0x02,  0x05,  0x03,  0x07,  0x0f,  0x0f,  0x07,  0x03,  0x00,  0x40,  0x60,  0x00,  0x00,  0x00,  0x00,  0x00,  0x40,  0xa0,  0xc0,  0xe0,  0xf0,  0xf0,  0xe0,  0xc0,  0x01,  0x03,  0x03,  0x03,  0x01,  0x00,  0x06,  0x00,  0x1a,  0x1c,  0x0c,  0x04,  0x06,  0x07,  0x06,  0x00,  0x80,  0xc0,  0xc0,  0xc0,  0x80,  0x00,  0x00,  0x60,  0x40,  0x20,  0x38,  0x38,  0x60,  0xe0,  0x60,  0x60,  0x00,  0x02,  0x06,  0x00,  0x00,  0x10,  0x10,  0x10,  0x02,  0x05,  0x03,  0x07,  0x0f,  0x0f,  0x07,  0x03,  0x00,  0x40,  0x60,  0x00,  0x00,  0x00,  0x00,  0x00,  0x40,  0xa0,  0xc0,  0xe0,  0xf0,  0xf0,  0xe0,  0xc0,  0x11,  0x13,  0x03,  0x03,  0x01,  0x00,  0x00,  0x06,  0x02,  0x04,  0x1c,  0x1c,  0x06,  0x07,  0x06,  0x06,  0x80,  0xc0,  0xc0,  0xc0,  0x80,  0x00,  0x60,  0x00,  0x58,  0x38,  0x30,  0x20,  0x60,  0xe0,  0x60,  0x00);
    vpatch(rom, 0x12600,   16,  0x00,  0x00,  0x01,  0x09,  0x09,  0x09,  0x01,  0x00,  0x03,  0x07,  0x07,  0x07,  0x07,  0x07,  0x07,  0x03);
    vpatch(rom, 0x12620,   16,  0x38,  0x71,  0x43,  0x4b,  0x79,  0x38,  0x00,  0x03,  0x3b,  0x4e,  0x7d,  0x75,  0x46,  0x3b,  0x01,  0x03);
    vpatch(rom, 0x12640,   16,  0x00,  0x00,  0x01,  0x09,  0x09,  0x09,  0x19,  0x3c,  0x03,  0x07,  0x07,  0x07,  0x07,  0x07,  0x1f,  0x23);
    vpatch(rom, 0x12660,   16,  0x24,  0x21,  0x33,  0x1b,  0x01,  0x00,  0x06,  0x00,  0x3b,  0x3e,  0x2d,  0x1d,  0x06,  0x07,  0x07,  0x00);
    vpatch(rom, 0x12710,   16,  0x00,  0x40,  0x60,  0x00,  0x00,  0x00,  0x00,  0x1c,  0x40,  0xa0,  0xc0,  0xe0,  0xf0,  0xf0,  0xe0,  0xdc);
    vpatch(rom, 0x12730,   16,  0xbe,  0xf6,  0xf6,  0xfe,  0x9c,  0x00,  0x00,  0x60,  0x62,  0x2a,  0x2a,  0x22,  0x7c,  0xe0,  0x60,  0x60);
    vpatch(rom, 0x12750,   16,  0x00,  0x40,  0x60,  0x00,  0x00,  0x00,  0x38,  0x7c,  0x40,  0xa0,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0xc4);
    vpatch(rom, 0x12770,   15,  0xec,  0xec,  0xfc,  0xf8,  0x80,  0x00,  0x60,  0x00,  0x54,  0x54,  0x44,  0x38,  0x60,  0xe0,  0x60);
    vpatch(rom, 0x12800,   16,  0x00,  0x00,  0x01,  0x09,  0x09,  0x09,  0x01,  0x00,  0x03,  0x07,  0x07,  0x07,  0x07,  0x07,  0x07,  0x03);
    vpatch(rom, 0x12820,   16,  0x38,  0x71,  0x43,  0x4b,  0x79,  0x38,  0x00,  0x03,  0x3b,  0x4e,  0x7d,  0x75,  0x46,  0x3b,  0x01,  0x03);
    vpatch(rom, 0x12840,   16,  0x00,  0x00,  0x01,  0x09,  0x09,  0x09,  0x19,  0x3c,  0x03,  0x07,  0x07,  0x07,  0x07,  0x07,  0x1f,  0x23);
    vpatch(rom, 0x12860,   16,  0x24,  0x21,  0x33,  0x1b,  0x01,  0x00,  0x06,  0x00,  0x3b,  0x3e,  0x2d,  0x1d,  0x06,  0x07,  0x07,  0x00);
    vpatch(rom, 0x12910,   16,  0x00,  0x40,  0x60,  0x00,  0x00,  0x00,  0x00,  0x1c,  0x40,  0xa0,  0xc0,  0xe0,  0xf0,  0xf0,  0xe0,  0xdc);
    vpatch(rom, 0x12930,   16,  0xbe,  0xf6,  0xf6,  0xfe,  0x9c,  0x00,  0x00,  0x60,  0x62,  0x2a,  0x2a,  0x22,  0x7c,  0xe0,  0x60,  0x60);
    vpatch(rom, 0x12950,   16,  0x00,  0x40,  0x60,  0x00,  0x00,  0x00,  0x38,  0x7c,  0x40,  0xa0,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0xc4);
    vpatch(rom, 0x12970,  144,  0xec,  0xec,  0xfc,  0xf8,  0x80,  0x00,  0x60,  0x00,  0x54,  0x54,  0x44,  0x38,  0x60,  0xe0,  0x60,  0x00,  0x00,  0x02,  0x03,  0x03,  0x00,  0x03,  0x07,  0x1f,  0x03,  0x01,  0x3a,  0x7e,  0x7f,  0x7c,  0x38,  0x1c,  0x00,  0x00,  0x00,  0x00,  0x20,  0x10,  0x90,  0xa0,  0x00,  0x80,  0x80,  0xc0,  0xe0,  0xf0,  0x70,  0x60,  0x3f,  0x36,  0x36,  0x3e,  0x1e,  0x03,  0x01,  0x00,  0x22,  0x2b,  0x2b,  0x23,  0x1d,  0x00,  0x01,  0x00,  0x60,  0x40,  0x70,  0x32,  0x04,  0x08,  0x80,  0x30,  0xe0,  0xc2,  0xb6,  0xcc,  0xf8,  0xf0,  0xf0,  0x30,  0x00,  0x02,  0x03,  0x03,  0x00,  0x03,  0x1f,  0x3f,  0x03,  0x01,  0x3a,  0x7e,  0x7f,  0x7c,  0x3c,  0x22,  0x00,  0x00,  0x00,  0x00,  0x20,  0x10,  0x90,  0xa0,  0x00,  0x80,  0x80,  0xc0,  0xe0,  0xf0,  0x70,  0x60,  0x37,  0x36,  0x3e,  0x1c,  0x06,  0x03,  0x01,  0x01,  0x2a,  0x2b,  0x23,  0x1f,  0x01,  0x00,  0x00,  0x01,  0x60,  0x40,  0x70,  0x32,  0x04,  0x08,  0x30,  0x80,  0xe0,  0xc2,  0xb6,  0xcc,  0xf8,  0xf0,  0xf0,  0x80);
    vpatch(rom, 0x12a20,  223,  0x1f,  0x1f,  0x1f,  0x10,  0x00,  0x00,  0x00,  0x03,  0x04,  0x04,  0x08,  0x03,  0x03,  0x03,  0x03,  0x03,  0xf0,  0xf8,  0xf8,  0xfc,  0x80,  0x00,  0x60,  0x00,  0x40,  0x40,  0x20,  0x20,  0x60,  0xe0,  0x60,  0x00,  0x07,  0x1f,  0x1f,  0x1f,  0x1f,  0x0f,  0x0f,  0x07,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0x0f,  0x00,  0x07,  0xe0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf0,  0xf0,  0xe0,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf0,  0x00,  0xe0,  0x0f,  0x1f,  0x1f,  0x3f,  0x01,  0x00,  0x06,  0x00,  0x02,  0x02,  0x04,  0x04,  0x06,  0x07,  0x06,  0x00,  0xf0,  0xf8,  0xf8,  0xf8,  0x08,  0x00,  0x00,  0xc0,  0x40,  0x20,  0x20,  0x10,  0xc0,  0xc0,  0xc0,  0xc0,  0x3a,  0x33,  0x7f,  0x7f,  0x7f,  0x7f,  0x37,  0x1c,  0x3f,  0x3f,  0x7f,  0x7e,  0x72,  0x78,  0x39,  0x13,  0x00,  0xa0,  0xe0,  0xe0,  0x00,  0x60,  0xf0,  0xf0,  0x60,  0xc0,  0xae,  0xbf,  0xff,  0x9f,  0x0e,  0x00,  0x0f,  0x3f,  0x3f,  0x7f,  0x7f,  0x08,  0x06,  0x00,  0x0f,  0x32,  0x29,  0x49,  0x50,  0x07,  0x07,  0x00,  0x60,  0x90,  0x90,  0x80,  0xb0,  0x60,  0x00,  0xc0,  0x90,  0x60,  0x6c,  0x7c,  0xc0,  0x80,  0xc0,  0xc0,  0x3a,  0x33,  0x7f,  0x7f,  0x7f,  0x7f,  0x37,  0x1c,  0x3f,  0x3f,  0x7f,  0x7e,  0x72,  0x78,  0x39,  0x13,  0x00,  0xa0,  0xe0,  0xe0,  0x00,  0x60,  0xf0,  0xf0,  0x60,  0xc0,  0xae,  0xbf,  0xff,  0x9f,  0x0e,  0x00,  0x3f,  0x3f,  0x3f,  0x7f,  0x7f,  0x06,  0x00,  0x03,  0x3f,  0x29,  0x24,  0x44,  0x48,  0x01,  0x03,  0x03,  0x60,  0x90,  0x90,  0x80,  0xb0,  0x60,  0x60,  0x00,  0x90,  0xe0,  0xec,  0xfc,  0x40,  0x80,  0xe0);
    vpatch(rom, 0x12b20,  224,  0x08,  0x08,  0x03,  0x13,  0x39,  0x38,  0x06,  0x00,  0x07,  0x07,  0x0c,  0x0c,  0x0e,  0x17,  0x06,  0x00,  0x10,  0x18,  0xc8,  0xcc,  0x9e,  0x1e,  0x06,  0x60,  0xe0,  0xe0,  0x30,  0x38,  0x68,  0xe4,  0x64,  0x60,  0x1f,  0x0f,  0x1d,  0x1a,  0x1e,  0x18,  0x10,  0x00,  0x0c,  0x03,  0x0f,  0x1d,  0x1b,  0x1f,  0x1f,  0x0f,  0xf8,  0xf0,  0xb8,  0x58,  0x78,  0x18,  0x08,  0x00,  0x30,  0xc0,  0xf0,  0xb8,  0xd8,  0xf8,  0xf8,  0xf0,  0x08,  0x18,  0x13,  0x33,  0x79,  0x78,  0x60,  0x06,  0x07,  0x07,  0x0c,  0x1c,  0x16,  0x27,  0x26,  0x06,  0x10,  0x10,  0xc0,  0xc8,  0x9c,  0x1c,  0x60,  0x00,  0xe0,  0xe0,  0x30,  0x30,  0x70,  0xe8,  0x60,  0x00,  0x00,  0x05,  0x07,  0x07,  0x00,  0x06,  0x0f,  0x0f,  0x06,  0x03,  0x75,  0xfd,  0xff,  0xf9,  0x70,  0x00,  0x5c,  0xcc,  0xfe,  0xfe,  0xfe,  0xfe,  0xec,  0x38,  0xfc,  0xfc,  0xfe,  0x7e,  0x4e,  0x1e,  0x9c,  0xc8,  0x06,  0x09,  0x09,  0x01,  0x0d,  0x06,  0x00,  0x03,  0x09,  0x06,  0x36,  0x3e,  0x03,  0x01,  0x03,  0x03,  0xf0,  0xfc,  0xfc,  0xfe,  0xfe,  0x10,  0x60,  0x00,  0xf0,  0x4c,  0x94,  0x92,  0x0a,  0xe0,  0xe0,  0x00,  0x00,  0x05,  0x07,  0x07,  0x00,  0x06,  0x0f,  0x0f,  0x06,  0x03,  0x75,  0xfd,  0xff,  0xf9,  0x70,  0x00,  0x5c,  0xcc,  0xfe,  0xfe,  0xfe,  0xfe,  0xec,  0x38,  0xfc,  0xfc,  0xfe,  0x7e,  0x4e,  0x1e,  0x9c,  0xc8,  0x06,  0x09,  0x09,  0x01,  0x0d,  0x06,  0x06,  0x00,  0x09,  0x07,  0x37,  0x3f,  0x02,  0x01,  0x07,  0x00,  0xfc,  0xfc,  0xfc,  0xfe,  0xfe,  0x60,  0x00,  0xc0,  0xfc,  0x94,  0x24,  0x22,  0x12,  0x80,  0xc0,  0xc0);
}